

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O3

localization_backend_manager __thiscall
booster::locale::localization_backend_manager::global
          (localization_backend_manager *this,localization_backend_manager *in)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device =
       (mutex_type *)(anonymous_namespace)::localization_backend_manager_mutex()::the_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  anon_unknown_0::localization_backend_manager_global();
  localization_backend_manager
            (this,&anon_unknown_0::localization_backend_manager_global::the_manager);
  anon_unknown_0::localization_backend_manager_global();
  operator=(&anon_unknown_0::localization_backend_manager_global::the_manager,in);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return (unique_ptr<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
          )(unique_ptr<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
            )this;
}

Assistant:

localization_backend_manager localization_backend_manager::global(localization_backend_manager const &in)
        {
            booster::unique_lock<booster::mutex> lock(localization_backend_manager_mutex());
            localization_backend_manager mgr = localization_backend_manager_global();
            localization_backend_manager_global() = in;
            return mgr;
        }